

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O0

void __thiscall SM83::rrc_dhl(SM83 *this)

{
  byte bVar1;
  bool b;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&>
  fmt;
  unsigned_short *in_stack_ffffffffffffffc8;
  u8 result;
  bool should_carry;
  u8 reg;
  SM83 *this_local;
  
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x46;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  RRC (HL)\n",fmt,
             &(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,in_stack_ffffffffffffffc8);
  bVar1 = Bus::Read8(this->bus,(this->field_3).hl,true);
  b = (bVar1 & 1) != 0;
  bVar1 = (byte)((int)(uint)bVar1 >> 1) | b << 7;
  SetZeroFlag(this,bVar1 == 0);
  SetNegateFlag(this,false);
  SetHalfCarryFlag(this,false);
  SetCarryFlag(this,b);
  Bus::Write8(this->bus,(this->field_3).hl,bVar1,true);
  return;
}

Assistant:

void SM83::rrc_dhl() {
    LTRACE("RRC (HL)");

    u8 reg = bus.Read8(hl);
    bool should_carry = reg & 0x1;
    u8 result = (reg >> 1) | (should_carry << 7);

    SetZeroFlag(result == 0);
    SetNegateFlag(false);
    SetHalfCarryFlag(false);
    SetCarryFlag(should_carry);

    bus.Write8(hl, result);
}